

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.h
# Opt level: O0

Vec3<float> Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>(Rand48 *rand)

{
  float fVar1;
  float *pfVar2;
  Vec3<float> *in_RDI;
  double dVar3;
  Vec3<float> VVar4;
  uint i;
  BaseType length;
  Vec3<float> v;
  bool local_41;
  float in_stack_ffffffffffffffc0;
  float a;
  Vec3<float> *this;
  float local_24;
  Vec3<float> local_1c [2];
  
  this = in_RDI;
  Vec3<float>::Vec3(local_1c);
  do {
    local_24 = 0.0;
    while (a = local_24, fVar1 = (float)Vec3<float>::dimensions(), (uint)a < (uint)fVar1) {
      dVar3 = Rand48::nextf((Rand48 *)this,(double)in_RDI,
                            (double)CONCAT44(a,in_stack_ffffffffffffffc0));
      in_stack_ffffffffffffffc0 = (float)dVar3;
      pfVar2 = Vec3<float>::operator[](local_1c,(int)local_24);
      *pfVar2 = in_stack_ffffffffffffffc0;
      local_24 = (float)((int)local_24 + 1);
    }
    fVar1 = Vec3<float>::length(in_RDI);
    local_41 = 1.0 < fVar1 || fVar1 == 0.0;
  } while (local_41);
  VVar4 = Vec3<float>::operator/(in_RDI,a);
  return VVar4;
}

Assistant:

IMATH_HOSTDEVICE Vec
hollowSphereRand (Rand& rand)
{
    Vec                    v;
    typename Vec::BaseType length;

    do
    {
        for (unsigned int i = 0; i < Vec::dimensions (); i++)
            v[i] = (typename Vec::BaseType) rand.nextf (-1, 1);

        length = v.length ();
    } while (length > 1 || length == 0);

    return v / length;
}